

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_rowcol_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  int *piVar2;
  uint *puVar3;
  undefined4 *puVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  int *piVar8;
  undefined1 auVar9 [16];
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  parasail_result_t *ppVar16;
  __m128i *ptr;
  int32_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int32_t iVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  __m128i *palVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  int iVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  int iVar44;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  int iVar49;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar50;
  int iVar51;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar52 [16];
  __m128i alVar53;
  int iVar57;
  uint uVar58;
  int iVar59;
  uint uVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  uint uVar65;
  uint uVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  __m128i_32_t e;
  __m128i_32_t h;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar6 = (profile->profile32).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_6();
      }
      else {
        uVar5 = profile->s1Len;
        if ((int)uVar5 < 1) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_1();
        }
        else {
          iVar13 = uVar5 - 1;
          uVar32 = (ulong)uVar5 + 3;
          uVar27 = uVar32 >> 2;
          uVar26 = (uint)uVar27;
          iVar14 = iVar13 / (int)uVar26;
          uVar25 = iVar13 % (int)uVar26;
          iVar34 = -open;
          iVar33 = ppVar7->min;
          uVar18 = 0x80000000 - iVar33;
          if (iVar33 != iVar34 && SBORROW4(iVar33,iVar34) == iVar33 + open < 0) {
            uVar18 = open | 0x80000000;
          }
          uVar15 = 0x7ffffffe - ppVar7->max;
          ppVar16 = parasail_result_new_rowcol1((uint)uVar32 & 0x7ffffffc,s2Len);
          if (ppVar16 != (parasail_result_t *)0x0) {
            ppVar16->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar16->flag | 0x4440402;
            ptr = parasail_memalign___m128i(0x10,uVar27);
            ptr_00 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,uVar27);
            ptr_02 = parasail_memalign___m128i(0x10,uVar27);
            ptr_03 = parasail_memalign___m128i(0x10,uVar27);
            uVar28 = 0;
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int32_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar17 = s2Len + -1;
              iVar22 = 3 - iVar14;
              uVar18 = uVar18 + 1;
              auVar35._4_4_ = uVar18;
              auVar35._0_4_ = uVar18;
              auVar35._8_4_ = uVar18;
              auVar35._12_4_ = uVar18;
              iVar19 = -(uVar26 * gap);
              iVar33 = iVar34;
              do {
                lVar21 = 0;
                iVar23 = iVar33;
                do {
                  iVar44 = 0;
                  if (s1_beg == 0) {
                    iVar44 = iVar23;
                  }
                  *(int *)((long)&local_48 + lVar21 * 4) = iVar44;
                  lVar31 = (long)iVar44 - (ulong)(uint)open;
                  if (lVar31 < -0x7fffffff) {
                    lVar31 = -0x80000000;
                  }
                  *(int *)((long)&local_58 + lVar21 * 4) = (int)lVar31;
                  lVar21 = lVar21 + 1;
                  iVar23 = iVar23 - uVar26 * gap;
                } while (lVar21 != 4);
                ptr_02[uVar28][0] = local_48;
                ptr_02[uVar28][1] = lStack_40;
                ptr[uVar28][0] = local_58;
                ptr[uVar28][1] = lStack_50;
                uVar28 = uVar28 + 1;
                iVar33 = iVar33 - gap;
              } while (uVar28 != uVar27);
              *ptr_00 = 0;
              uVar28 = 1;
              do {
                iVar24 = 0;
                if (s2_beg == 0) {
                  iVar24 = iVar34;
                }
                ptr_00[uVar28] = iVar24;
                uVar28 = uVar28 + 1;
                iVar34 = iVar34 - gap;
              } while (s2Len + 1 != uVar28);
              iVar33 = -open;
              iVar34 = -open;
              iVar23 = -open;
              iVar44 = -open;
              palVar29 = ptr_03 + (uVar26 - 1);
              uVar28 = uVar27;
              uVar37 = uVar15;
              uVar38 = uVar15;
              uVar39 = uVar15;
              uVar40 = uVar15;
              do {
                *(int *)*palVar29 = iVar33;
                *(int *)((long)*palVar29 + 4) = iVar34;
                *(int *)(*palVar29 + 1) = iVar23;
                *(int *)((long)*palVar29 + 0xc) = iVar44;
                iVar33 = iVar33 - gap;
                iVar34 = iVar34 - gap;
                iVar23 = iVar23 - gap;
                iVar44 = iVar44 - gap;
                uVar37 = (uint)(iVar33 < (int)uVar37) * iVar33 | (iVar33 >= (int)uVar37) * uVar37;
                uVar38 = (uint)(iVar34 < (int)uVar38) * iVar34 | (iVar34 >= (int)uVar38) * uVar38;
                uVar39 = (uint)(iVar23 < (int)uVar39) * iVar23 | (iVar23 >= (int)uVar39) * uVar39;
                uVar40 = (uint)(iVar44 < (int)uVar40) * iVar44 | (iVar44 >= (int)uVar40) * uVar40;
                palVar29 = palVar29 + -1;
                iVar55 = (int)uVar28;
                uVar20 = iVar55 - 1;
                uVar28 = (ulong)uVar20;
              } while (uVar20 != 0 && 0 < iVar55);
              palVar29 = ptr_02 + (uVar26 - 1);
              iVar33 = 1;
              if (1 < iVar22) {
                iVar33 = iVar22;
              }
              uVar28 = 1;
              if (1 < s2Len) {
                uVar28 = (ulong)(uint)s2Len;
              }
              lVar21 = (ulong)(uVar26 + (uVar26 == 0)) << 4;
              uVar30 = 0;
              auVar42 = auVar35;
              auVar47 = auVar35;
              iVar34 = iVar17;
              do {
                iVar23 = ppVar7->mapper[(byte)s2[uVar30]];
                uVar20 = uVar18 - (int)(*ptr_03)[0];
                uVar58 = uVar18 - *(int *)((long)*ptr_03 + 4);
                uVar60 = uVar18 - (int)(*ptr_03)[1];
                auVar46._0_4_ = uVar18 - *(int *)((long)*ptr_03 + 0xc);
                lVar31 = 0;
                auVar41 = auVar35;
                iVar24 = ptr_00[uVar30];
                iVar44 = (int)(*palVar29)[0];
                iVar55 = *(int *)((long)*palVar29 + 4);
                iVar56 = (int)(*palVar29)[1];
                do {
                  piVar8 = (int *)((long)*ptr_02 + lVar31);
                  iVar63 = *piVar8;
                  iVar51 = piVar8[1];
                  iVar54 = piVar8[2];
                  iVar49 = piVar8[3];
                  piVar8 = (int *)((long)*ptr + lVar31);
                  piVar2 = (int *)((long)pvVar6 + lVar31 + (long)iVar23 * uVar27 * 0x10);
                  iVar50 = iVar24 + *piVar2;
                  iVar44 = iVar44 + piVar2[1];
                  iVar55 = iVar55 + piVar2[2];
                  iVar56 = iVar56 + piVar2[3];
                  piVar2 = (int *)((long)*ptr_03 + lVar31);
                  iVar57 = uVar20 + *piVar2;
                  iVar59 = uVar58 + piVar2[1];
                  iVar61 = uVar60 + piVar2[2];
                  iVar62 = auVar46._0_4_ + piVar2[3];
                  iVar67 = *piVar8 - gap;
                  iVar68 = piVar8[1] - gap;
                  iVar69 = piVar8[2] - gap;
                  iVar70 = piVar8[3] - gap;
                  iVar64 = auVar41._0_4_;
                  auVar45._0_4_ =
                       (uint)(iVar64 < iVar57) * iVar57 | (uint)(iVar64 >= iVar57) * iVar64;
                  iVar64 = auVar41._4_4_;
                  auVar45._4_4_ =
                       (uint)(iVar64 < iVar59) * iVar59 | (uint)(iVar64 >= iVar59) * iVar64;
                  iVar64 = auVar41._8_4_;
                  iVar57 = auVar41._12_4_;
                  auVar45._8_4_ =
                       (uint)(iVar64 < iVar61) * iVar61 | (uint)(iVar64 >= iVar61) * iVar64;
                  auVar45._12_4_ =
                       (uint)(iVar57 < iVar62) * iVar62 | (uint)(iVar57 >= iVar62) * iVar57;
                  iVar64 = iVar63 - open;
                  iVar57 = iVar51 - open;
                  iVar59 = iVar54 - open;
                  iVar61 = iVar49 - open;
                  auVar46._4_4_ =
                       (uint)(iVar64 < iVar67) * iVar67 | (uint)(iVar64 >= iVar67) * iVar64;
                  auVar46._8_4_ =
                       (uint)(iVar57 < iVar68) * iVar68 | (uint)(iVar57 >= iVar68) * iVar57;
                  uVar65 = (uint)(iVar59 < iVar69) * iVar69 | (uint)(iVar59 >= iVar69) * iVar59;
                  uVar66 = (uint)(iVar61 < iVar70) * iVar70 | (uint)(iVar61 >= iVar70) * iVar61;
                  uVar20 = (iVar50 < (int)auVar46._4_4_) * auVar46._4_4_ |
                           (uint)(iVar50 >= (int)auVar46._4_4_) * iVar50;
                  uVar58 = (iVar44 < (int)auVar46._8_4_) * auVar46._8_4_ |
                           (uint)(iVar44 >= (int)auVar46._8_4_) * iVar44;
                  uVar60 = (iVar55 < (int)uVar65) * uVar65 | (uint)(iVar55 >= (int)uVar65) * iVar55;
                  auVar46._0_4_ =
                       (iVar56 < (int)uVar66) * uVar66 | (uint)(iVar56 >= (int)uVar66) * iVar56;
                  puVar3 = (uint *)((long)*ptr + lVar31);
                  *puVar3 = auVar46._4_4_;
                  puVar3[1] = auVar46._8_4_;
                  puVar3[2] = uVar65;
                  puVar3[3] = uVar66;
                  puVar3 = (uint *)((long)*ptr_01 + lVar31);
                  *puVar3 = uVar20;
                  puVar3[1] = uVar58;
                  puVar3[2] = uVar60;
                  puVar3[3] = auVar46._0_4_;
                  lVar31 = lVar31 + 0x10;
                  auVar41 = auVar45;
                  iVar24 = iVar63;
                  iVar44 = iVar51;
                  iVar55 = iVar54;
                  iVar56 = iVar49;
                } while (lVar21 != lVar31);
                uVar1 = uVar30 + 1;
                iVar23 = ptr_00[uVar30 + 1];
                iVar44 = (int)(*ptr_03)[0] + iVar23;
                iVar55 = *(int *)((long)*ptr_03 + 4) + uVar20;
                iVar56 = (int)(*ptr_03)[1] + uVar58;
                iVar63 = *(int *)((long)*ptr_03 + 0xc) + uVar60;
                auVar41._0_4_ =
                     (uint)((int)auVar45._0_4_ < iVar44) * iVar44 |
                     ((int)auVar45._0_4_ >= iVar44) * auVar45._0_4_;
                auVar41._4_4_ =
                     (uint)((int)auVar45._4_4_ < iVar55) * iVar55 |
                     ((int)auVar45._4_4_ >= iVar55) * auVar45._4_4_;
                auVar41._8_4_ =
                     (uint)((int)auVar45._8_4_ < iVar56) * iVar56 |
                     ((int)auVar45._8_4_ >= iVar56) * auVar45._8_4_;
                auVar41._12_4_ =
                     (uint)((int)auVar45._12_4_ < iVar63) * iVar63 |
                     ((int)auVar45._12_4_ >= iVar63) * auVar45._12_4_;
                iVar44 = 1;
                do {
                  iVar56 = auVar41._0_4_;
                  iVar55 = iVar56 + iVar19;
                  iVar51 = auVar41._4_4_;
                  iVar54 = auVar41._8_4_;
                  iVar63 = iVar51 + iVar19;
                  iVar49 = iVar54 + iVar19;
                  auVar46._0_4_ =
                       (uint)((int)uVar18 < iVar56) * iVar56 | ((int)uVar18 >= iVar56) * uVar18;
                  auVar46._4_4_ =
                       (uint)(iVar55 < iVar51) * iVar51 | (uint)(iVar55 >= iVar51) * iVar55;
                  auVar46._8_4_ =
                       (uint)(iVar63 < iVar54) * iVar54 | (uint)(iVar63 >= iVar54) * iVar63;
                  iVar55 = auVar41._12_4_;
                  auVar46._12_4_ =
                       (uint)(iVar49 < iVar55) * iVar55 | (uint)(iVar49 >= iVar55) * iVar49;
                  iVar44 = iVar44 + -1;
                  auVar41 = auVar46;
                } while (iVar44 == 0);
                uVar65 = (iVar23 < (int)uVar18) * uVar18 | (uint)(iVar23 >= (int)uVar18) * iVar23;
                uVar66 = ((int)uVar20 < (int)auVar46._0_4_) * auVar46._0_4_ |
                         ((int)uVar20 >= (int)auVar46._0_4_) * uVar20;
                uVar58 = ((int)uVar58 < (int)auVar46._4_4_) * auVar46._4_4_ |
                         ((int)uVar58 >= (int)auVar46._4_4_) * uVar58;
                uVar60 = ((int)uVar60 < (int)auVar46._8_4_) * auVar46._8_4_ |
                         ((int)uVar60 >= (int)auVar46._8_4_) * uVar60;
                lVar31 = 0;
                auVar41 = auVar42;
                uVar20 = uVar18;
                do {
                  iVar23 = uVar20 - gap;
                  iVar55 = auVar46._0_4_ - gap;
                  iVar56 = auVar46._4_4_ - gap;
                  iVar63 = auVar46._8_4_ - gap;
                  iVar51 = uVar65 - open;
                  iVar54 = uVar66 - open;
                  iVar49 = uVar58 - open;
                  iVar64 = uVar60 - open;
                  uVar20 = (uint)(iVar23 < iVar51) * iVar51 | (uint)(iVar23 >= iVar51) * iVar23;
                  auVar46._0_4_ =
                       (uint)(iVar55 < iVar54) * iVar54 | (uint)(iVar55 >= iVar54) * iVar55;
                  auVar46._4_4_ =
                       (uint)(iVar56 < iVar49) * iVar49 | (uint)(iVar56 >= iVar49) * iVar56;
                  auVar46._8_4_ =
                       (uint)(iVar63 < iVar64) * iVar64 | (uint)(iVar63 >= iVar64) * iVar63;
                  piVar8 = (int *)((long)*ptr_01 + lVar31);
                  iVar23 = *piVar8;
                  iVar55 = piVar8[1];
                  iVar56 = piVar8[2];
                  iVar63 = piVar8[3];
                  uVar65 = (iVar23 < (int)uVar20) * uVar20 | (uint)(iVar23 >= (int)uVar20) * iVar23;
                  uVar66 = (iVar55 < (int)auVar46._0_4_) * auVar46._0_4_ |
                           (uint)(iVar55 >= (int)auVar46._0_4_) * iVar55;
                  uVar58 = (iVar56 < (int)auVar46._4_4_) * auVar46._4_4_ |
                           (uint)(iVar56 >= (int)auVar46._4_4_) * iVar56;
                  uVar60 = (iVar63 < (int)auVar46._8_4_) * auVar46._8_4_ |
                           (uint)(iVar63 >= (int)auVar46._8_4_) * iVar63;
                  puVar3 = (uint *)((long)*ptr_02 + lVar31);
                  *puVar3 = uVar65;
                  puVar3[1] = uVar66;
                  puVar3[2] = uVar58;
                  puVar3[3] = uVar60;
                  uVar37 = ((int)uVar20 < (int)uVar37) * uVar20 |
                           ((int)uVar20 >= (int)uVar37) * uVar37;
                  uVar38 = ((int)auVar46._0_4_ < (int)uVar38) * auVar46._0_4_ |
                           ((int)auVar46._0_4_ >= (int)uVar38) * uVar38;
                  uVar39 = ((int)auVar46._4_4_ < (int)uVar39) * auVar46._4_4_ |
                           ((int)auVar46._4_4_ >= (int)uVar39) * uVar39;
                  uVar40 = ((int)auVar46._8_4_ < (int)uVar40) * auVar46._8_4_ |
                           ((int)auVar46._8_4_ >= (int)uVar40) * uVar40;
                  uVar37 = ((int)uVar65 < (int)uVar37) * uVar65 |
                           ((int)uVar65 >= (int)uVar37) * uVar37;
                  uVar38 = ((int)uVar66 < (int)uVar38) * uVar66 |
                           ((int)uVar66 >= (int)uVar38) * uVar38;
                  uVar39 = ((int)uVar58 < (int)uVar39) * uVar58 |
                           ((int)uVar58 >= (int)uVar39) * uVar39;
                  uVar40 = ((int)uVar60 < (int)uVar40) * uVar60 |
                           ((int)uVar60 >= (int)uVar40) * uVar40;
                  iVar23 = auVar41._0_4_;
                  auVar42._0_4_ =
                       (iVar23 < (int)uVar65) * uVar65 | (uint)(iVar23 >= (int)uVar65) * iVar23;
                  iVar23 = auVar41._4_4_;
                  auVar42._4_4_ =
                       (iVar23 < (int)uVar66) * uVar66 | (uint)(iVar23 >= (int)uVar66) * iVar23;
                  iVar23 = auVar41._8_4_;
                  iVar55 = auVar41._12_4_;
                  auVar42._8_4_ =
                       (iVar23 < (int)uVar58) * uVar58 | (uint)(iVar23 >= (int)uVar58) * iVar23;
                  auVar42._12_4_ =
                       (iVar55 < (int)uVar60) * uVar60 | (uint)(iVar55 >= (int)uVar60) * iVar55;
                  lVar31 = lVar31 + 0x10;
                  auVar41 = auVar42;
                } while (lVar21 != lVar31);
                alVar53 = ptr_02[uVar25];
                iVar55 = auVar47._0_4_;
                iVar54 = (int)alVar53[0];
                auVar52._0_4_ = -(uint)(iVar55 < iVar54);
                iVar56 = auVar47._4_4_;
                iVar49 = alVar53[0]._4_4_;
                auVar52._4_4_ = -(uint)(iVar56 < iVar49);
                iVar63 = auVar47._8_4_;
                iVar64 = (int)alVar53[1];
                iVar57 = alVar53[1]._4_4_;
                auVar52._8_4_ = -(uint)(iVar63 < iVar64);
                iVar51 = auVar47._12_4_;
                auVar52._12_4_ = -(uint)(iVar51 < iVar57);
                auVar9._4_4_ = -(uint)(iVar22 == 2);
                auVar9._0_4_ = -(uint)(iVar22 == 3);
                auVar9._8_4_ = -(uint)(iVar22 == 1);
                auVar9._12_4_ = -(uint)(iVar22 == 0);
                iVar23 = movmskps(iVar44,auVar52 & auVar9);
                if (iVar23 != 0) {
                  iVar34 = (int)uVar30;
                }
                iVar23 = iVar33;
                if (iVar14 < 3) {
                  do {
                    lVar31 = alVar53[1];
                    alVar53[1] = alVar53[0];
                    alVar53[0] = alVar53[1] << 0x20;
                    alVar53[1] = lVar31 << 0x20 | alVar53[1] >> 0x20;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                ((ppVar16->field_4).rowcols)->score_row[uVar30] = (int)(alVar53[1] >> 0x20);
                auVar47._0_4_ = (uint)(iVar54 < iVar55) * iVar55 | (uint)(iVar54 >= iVar55) * iVar54
                ;
                auVar47._4_4_ = (uint)(iVar49 < iVar56) * iVar56 | (uint)(iVar49 >= iVar56) * iVar49
                ;
                auVar47._8_4_ = (uint)(iVar64 < iVar63) * iVar63 | (uint)(iVar64 >= iVar63) * iVar64
                ;
                auVar47._12_4_ =
                     (uint)(iVar57 < iVar51) * iVar51 | (uint)(iVar57 >= iVar51) * iVar57;
                uVar30 = uVar1;
              } while (uVar1 != uVar28);
              lVar21 = 0;
              do {
                puVar4 = (undefined4 *)((long)*ptr_02 + lVar21 * 4);
                uVar10 = puVar4[1];
                uVar11 = puVar4[2];
                uVar12 = puVar4[3];
                piVar8 = ((ppVar16->field_4).rowcols)->score_col;
                *(undefined4 *)((long)piVar8 + lVar21) = *puVar4;
                *(undefined4 *)((long)piVar8 + uVar27 * 4 + lVar21) = uVar10;
                *(undefined4 *)((long)piVar8 + uVar27 * 8 + lVar21) = uVar11;
                *(undefined4 *)((long)piVar8 + uVar27 * 0xc + lVar21) = uVar12;
                lVar21 = lVar21 + 4;
              } while ((ulong)(uVar26 + (uVar26 == 0)) << 2 != lVar21);
              uVar20 = uVar18;
              if ((s2_end != 0) && (uVar20 = auVar47._12_4_, iVar14 < 3)) {
                iVar33 = 1;
                if (1 < iVar22) {
                  iVar33 = iVar22;
                }
                do {
                  auVar48._0_8_ = auVar47._0_8_ << 0x20;
                  auVar48._8_8_ = auVar47._8_8_ << 0x20 | auVar47._0_8_ >> 0x20;
                  uVar20 = auVar47._8_4_;
                  iVar33 = iVar33 + -1;
                  auVar47 = auVar48;
                } while (iVar33 != 0);
              }
              iVar33 = iVar13;
              if ((s1_end != 0) && ((uVar32 & 0x7ffffffc) != 0)) {
                uVar32 = 0;
                do {
                  iVar19 = ((uint)uVar32 & 3) * uVar26 + ((uint)(uVar32 >> 2) & 0x3fffffff);
                  iVar23 = iVar34;
                  uVar58 = uVar20;
                  iVar44 = iVar33;
                  if ((iVar19 < (int)uVar5) &&
                     (uVar60 = *(uint *)((long)*ptr_02 + uVar32 * 4), iVar23 = iVar17,
                     uVar58 = uVar60, iVar44 = iVar19, (int)uVar60 <= (int)uVar20)) {
                    if (iVar33 <= iVar19) {
                      iVar19 = iVar33;
                    }
                    iVar23 = iVar34;
                    uVar58 = uVar20;
                    iVar44 = iVar33;
                    if (iVar34 == iVar17 && uVar60 == uVar20) {
                      iVar44 = iVar19;
                    }
                  }
                  iVar33 = iVar44;
                  uVar20 = uVar58;
                  iVar34 = iVar23;
                  uVar32 = uVar32 + 1;
                } while ((uVar26 & 0x1fffffff) << 2 != (int)uVar32);
              }
              if (s2_end == 0 && s1_end == 0) {
                s1_end = uVar25 * 0x10;
                uVar32 = ptr_02[uVar25][0];
                uVar27 = ptr_02[uVar25][1];
                if (iVar14 < 3) {
                  s1_end = 1;
                  if (1 < iVar22) {
                    s1_end = iVar22;
                  }
                  do {
                    uVar27 = uVar27 << 0x20 | uVar32 >> 0x20;
                    s1_end = s1_end + -1;
                    uVar32 = uVar32 << 0x20;
                  } while (s1_end != 0);
                }
                uVar20 = (uint)(uVar27 >> 0x20);
                iVar34 = iVar17;
                iVar33 = iVar13;
              }
              auVar36._0_4_ = -(uint)((int)uVar37 < (int)uVar18);
              auVar36._4_4_ = -(uint)((int)uVar38 < (int)uVar18);
              auVar36._8_4_ = -(uint)((int)uVar39 < (int)uVar18);
              auVar36._12_4_ = -(uint)((int)uVar40 < (int)uVar18);
              auVar43._0_4_ = -(uint)((int)uVar15 < (int)auVar42._0_4_);
              auVar43._4_4_ = -(uint)((int)uVar15 < (int)auVar42._4_4_);
              auVar43._8_4_ = -(uint)((int)uVar15 < (int)auVar42._8_4_);
              auVar43._12_4_ = -(uint)((int)uVar15 < (int)auVar42._12_4_);
              iVar13 = movmskps(s1_end,auVar43 | auVar36);
              if (iVar13 != 0) {
                *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
                uVar20 = 0;
                iVar34 = 0;
                iVar33 = 0;
              }
              ppVar16->score = uVar20;
              ppVar16->end_query = iVar33;
              ppVar16->end_ref = iVar34;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar16;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32 (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}